

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalGraph.cpp
# Opt level: O0

void __thiscall wasm::LocalGraphFlower::prepareFlowBlocks(LocalGraphFlower *this)

{
  bool bVar1;
  size_type sVar2;
  ulong uVar3;
  reference pvVar4;
  reference pvVar5;
  mapped_type *ppFVar6;
  pointer pBVar7;
  vector<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
  *this_00;
  iterator __first;
  iterator __last;
  iterator __result;
  size_type __n;
  unordered_map<unsigned_int,_wasm::LocalSet_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::LocalSet_*>_>_>
  *this_01;
  reference ppVar8;
  reference local_a8;
  undefined1 local_98 [8];
  pair<const_unsigned_int,_wasm::LocalSet_*> set;
  iterator __end3;
  iterator __begin3;
  unordered_map<unsigned_int,_wasm::LocalSet_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::LocalSet_*>_>_>
  *__range3;
  vector<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
  *in;
  value_type *flowBlock;
  value_type *block_1;
  pointer pBStack_28;
  Index i_1;
  BasicBlock *block;
  size_t sStack_18;
  Index i;
  size_t numLocals;
  LocalGraphFlower *this_local;
  
  numLocals = (size_t)this;
  sStack_18 = Function::getNumLocals(this->func);
  sVar2 = std::
          vector<std::unique_ptr<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>_>_>
          ::size(&(this->
                  super_CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>
                  ).basicBlocks);
  std::vector<wasm::LocalGraphFlower::FlowBlock,_std::allocator<wasm::LocalGraphFlower::FlowBlock>_>
  ::resize(&this->flowBlocks,sVar2);
  std::vector<bool,_std::allocator<bool>_>::resize(&this->hasSet,sStack_18,false);
  block._4_4_ = 0;
  while( true ) {
    uVar3 = (ulong)block._4_4_;
    sVar2 = std::
            vector<std::unique_ptr<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>_>_>
            ::size(&(this->
                    super_CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>
                    ).basicBlocks);
    if (sVar2 <= uVar3) break;
    pvVar4 = std::
             vector<std::unique_ptr<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>_>_>
             ::operator[](&(this->
                           super_CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>
                           ).basicBlocks,(ulong)block._4_4_);
    pBStack_28 = std::
                 unique_ptr<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>
                 ::get(pvVar4);
    pvVar5 = std::
             vector<wasm::LocalGraphFlower::FlowBlock,_std::allocator<wasm::LocalGraphFlower::FlowBlock>_>
             ::operator[](&this->flowBlocks,(ulong)block._4_4_);
    ppFVar6 = std::
              unordered_map<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_wasm::LocalGraphFlower::FlowBlock_*,_std::hash<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*const,_wasm::LocalGraphFlower::FlowBlock_*>_>_>
              ::operator[](&this->basicToFlowMap,&stack0xffffffffffffffd8);
    *ppFVar6 = pvVar5;
    block._4_4_ = block._4_4_ + 1;
  }
  block_1._4_4_ = 0;
  while( true ) {
    sVar2 = std::
            vector<wasm::LocalGraphFlower::FlowBlock,_std::allocator<wasm::LocalGraphFlower::FlowBlock>_>
            ::size(&this->flowBlocks);
    if (sVar2 <= block_1._4_4_) break;
    pvVar4 = std::
             vector<std::unique_ptr<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>_>_>
             ::operator[](&(this->
                           super_CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>
                           ).basicBlocks,(ulong)block_1._4_4_);
    pvVar5 = std::
             vector<wasm::LocalGraphFlower::FlowBlock,_std::allocator<wasm::LocalGraphFlower::FlowBlock>_>
             ::operator[](&this->flowBlocks,(ulong)block_1._4_4_);
    pBVar7 = std::
             unique_ptr<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>
             ::get(pvVar4);
    if (pBVar7 == (this->
                  super_CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>
                  ).entry) {
      this->entryFlowBlock = pvVar5;
    }
    pvVar5->lastTraversedIteration = 0xffffffffffffffff;
    pBVar7 = std::
             unique_ptr<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>
             ::operator->(pvVar4);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::swap
              (&pvVar5->actions,
               (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)pBVar7);
    pBVar7 = std::
             unique_ptr<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>
             ::operator->(pvVar4);
    this_00 = &pBVar7->in;
    sVar2 = std::
            vector<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
            ::size(this_00);
    std::
    vector<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>
    ::resize(&pvVar5->in,sVar2);
    __first = std::
              vector<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
              ::begin(this_00);
    __last = std::
             vector<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
             ::end(this_00);
    __result = std::
               vector<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>
               ::begin(&pvVar5->in);
    std::
    transform<__gnu_cxx::__normal_iterator<wasm::CFGWalker<wasm::LocalGraphFlower,wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,void>,wasm::(anonymous_namespace)::Info>::BasicBlock**,std::vector<wasm::CFGWalker<wasm::LocalGraphFlower,wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,void>,wasm::(anonymous_namespace)::Info>::BasicBlock*,std::allocator<wasm::CFGWalker<wasm::LocalGraphFlower,wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,void>,wasm::(anonymous_namespace)::Info>::BasicBlock*>>>,__gnu_cxx::__normal_iterator<wasm::LocalGraphFlower::FlowBlock**,std::vector<wasm::LocalGraphFlower::FlowBlock*,std::allocator<wasm::LocalGraphFlower::FlowBlock*>>>,wasm::LocalGraphFlower::prepareFlowBlocks()::_lambda(wasm::CFGWalker<wasm::LocalGraphFlower,wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,void>,wasm::(anonymous_namespace)::Info>::BasicBlock*)_1_>
              ((__normal_iterator<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_**,_std::vector<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>_>
                )__first._M_current,
               (__normal_iterator<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_**,_std::vector<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>_>
                )__last._M_current,
               (__normal_iterator<wasm::LocalGraphFlower::FlowBlock_**,_std::vector<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>_>
                )__result._M_current,(anon_class_8_1_8991fb9c)this);
    pBVar7 = std::
             unique_ptr<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>
             ::operator->(pvVar4);
    __n = std::
          unordered_map<unsigned_int,_wasm::LocalSet_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::LocalSet_*>_>_>
          ::size(&(pBVar7->contents).lastSets);
    std::
    vector<std::pair<unsigned_int,_wasm::LocalSet_*>,_std::allocator<std::pair<unsigned_int,_wasm::LocalSet_*>_>_>
    ::reserve(&pvVar5->lastSets,__n);
    pBVar7 = std::
             unique_ptr<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>
             ::operator->(pvVar4);
    this_01 = &(pBVar7->contents).lastSets;
    __end3 = std::
             unordered_map<unsigned_int,_wasm::LocalSet_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::LocalSet_*>_>_>
             ::begin(this_01);
    set.second = (LocalSet *)
                 std::
                 unordered_map<unsigned_int,_wasm::LocalSet_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::LocalSet_*>_>_>
                 ::end(this_01);
    while( true ) {
      bVar1 = std::__detail::operator!=
                        (&__end3.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::LocalSet_*>,_false>
                         ,(_Node_iterator_base<std::pair<const_unsigned_int,_wasm::LocalSet_*>,_false>
                           *)&set.second);
      if (!bVar1) break;
      ppVar8 = std::__detail::
               _Node_iterator<std::pair<const_unsigned_int,_wasm::LocalSet_*>,_false,_false>::
               operator*(&__end3);
      local_98 = *(undefined1 (*) [8])ppVar8;
      set._0_8_ = ppVar8->second;
      std::
      vector<std::pair<unsigned_int,wasm::LocalSet*>,std::allocator<std::pair<unsigned_int,wasm::LocalSet*>>>
      ::emplace_back<std::pair<unsigned_int_const,wasm::LocalSet*>&>
                ((vector<std::pair<unsigned_int,wasm::LocalSet*>,std::allocator<std::pair<unsigned_int,wasm::LocalSet*>>>
                  *)&pvVar5->lastSets,(pair<const_unsigned_int,_wasm::LocalSet_*> *)local_98);
      local_a8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (&this->hasSet,(ulong)local_98 & 0xffffffff);
      std::_Bit_reference::operator=(&local_a8,true);
      std::__detail::_Node_iterator<std::pair<const_unsigned_int,_wasm::LocalSet_*>,_false,_false>::
      operator++(&__end3);
    }
    block_1._4_4_ = block_1._4_4_ + 1;
  }
  if (this->entryFlowBlock != (FlowBlock *)0x0) {
    return;
  }
  __assert_fail("entryFlowBlock != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/LocalGraph.cpp"
                ,0xb2,"void wasm::LocalGraphFlower::prepareFlowBlocks()");
}

Assistant:

void prepareFlowBlocks() {
    auto numLocals = func->getNumLocals();

    // Convert input blocks (basicBlocks) into more efficient flow blocks to
    // improve memory access.
    flowBlocks.resize(basicBlocks.size());

    hasSet.resize(numLocals, false);

    // Init mapping between basicblocks and flowBlocks
    for (Index i = 0; i < basicBlocks.size(); ++i) {
      auto* block = basicBlocks[i].get();
      basicToFlowMap[block] = &flowBlocks[i];
    }

    for (Index i = 0; i < flowBlocks.size(); ++i) {
      auto& block = basicBlocks[i];
      auto& flowBlock = flowBlocks[i];
      // Get the equivalent block to entry in the flow list
      if (block.get() == entry) {
        entryFlowBlock = &flowBlock;
      }
      flowBlock.lastTraversedIteration = FlowBlock::NULL_ITERATION;
      flowBlock.actions.swap(block->contents.actions);
      // Map in block to flow blocks
      auto& in = block->in;
      flowBlock.in.resize(in.size());
      std::transform(in.begin(),
                     in.end(),
                     flowBlock.in.begin(),
                     [&](BasicBlock* block) { return basicToFlowMap[block]; });
      // Convert unordered_map to vector.
      flowBlock.lastSets.reserve(block->contents.lastSets.size());
      for (auto set : block->contents.lastSets) {
        flowBlock.lastSets.emplace_back(set);
        hasSet[set.first] = true;
      }
    }
    assert(entryFlowBlock != nullptr);
  }